

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O0

int verify_fits(char *infile,FILE *out)

{
  int iVar1;
  ushort **ppuVar2;
  size_t sVar3;
  bool bVar4;
  char local_558 [8];
  char xtension [80];
  char *pfile;
  char *p;
  int len;
  int i;
  int status;
  int hdutype;
  FitsHdu fitshdu;
  fitsfile *infits;
  char rootnam [1025];
  FILE *out_local;
  char *infile_local;
  
  unique0x100003eb = out;
  memset(&infits,0,0x401);
  len = 0;
  pfile = infile;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*pfile] & 0x2000) != 0) {
    pfile = pfile + 1;
  }
  sVar3 = strlen(pfile);
  p._4_4_ = (int)sVar3;
  xtension._72_8_ = pfile;
  pfile = pfile + (p._4_4_ + -1);
  while( true ) {
    p._4_4_ = p._4_4_ + -1;
    bVar4 = false;
    if (-1 < p._4_4_) {
      ppuVar2 = __ctype_b_loc();
      bVar4 = ((*ppuVar2)[(int)*pfile] & 0x2000) != 0;
    }
    if (!bVar4) break;
    *pfile = '\0';
    pfile = pfile + -1;
  }
  sVar3 = strlen((char *)xtension._72_8_);
  if (sVar3 == 0) {
    infile_local._4_4_ = len;
  }
  else {
    wrtout(stack0xffffffffffffffe0," ");
    sprintf(comm,"File: %s",xtension._72_8_);
    wrtout(stack0xffffffffffffffe0,comm);
    totalhdu = 0;
    iVar1 = ffdkopn(&fitshdu.use_longstr,xtension._72_8_,0,&len);
    if (iVar1 == 0) {
      iVar1 = ffthdu(fitshdu._176_8_,&totalhdu,&len);
      if (iVar1 == 0) {
        init_report(stack0xffffffffffffffe0,(char *)&infits);
        for (p._4_4_ = 1; p._4_4_ <= totalhdu; p._4_4_ = p._4_4_ + 1) {
          i = -1;
          iVar1 = ffmahd(fitshdu._176_8_,p._4_4_,&i,&len);
          if (iVar1 != 0) {
            print_title(stack0xffffffffffffffe0,p._4_4_,i);
            wrtferr(stack0xffffffffffffffe0,"",&len,2);
            set_hdubasic(p._4_4_,i);
            break;
          }
          if ((p._4_4_ == 1) || (i != 0)) {
            print_title(stack0xffffffffffffffe0,p._4_4_,i);
          }
          else {
            ffgky(fitshdu._176_8_,0x10,"XTENSION",local_558,0,&len);
            iVar1 = strcmp(local_558,"BINTABLE");
            if (iVar1 == 0) {
              print_title(stack0xffffffffffffffe0,p._4_4_,2);
            }
            else {
              print_title(stack0xffffffffffffffe0,p._4_4_,i);
            }
          }
          init_hdu((fitsfile *)fitshdu._176_8_,stack0xffffffffffffffe0,p._4_4_,i,(FitsHdu *)&status)
          ;
          test_hdu((fitsfile *)fitshdu._176_8_,stack0xffffffffffffffe0,(FitsHdu *)&status);
          if (testdata != 0) {
            test_data((fitsfile *)fitshdu._176_8_,stack0xffffffffffffffe0,(FitsHdu *)&status);
          }
          close_err(stack0xffffffffffffffe0);
          if (prhead != 0) {
            print_header(stack0xffffffffffffffe0);
          }
          if (prstat != 0) {
            print_summary((fitsfile *)fitshdu._176_8_,stack0xffffffffffffffe0,(FitsHdu *)&status);
          }
          close_hdu((FitsHdu *)&status);
        }
        test_end((fitsfile *)fitshdu._176_8_,stack0xffffffffffffffe0);
        close_report(stack0xffffffffffffffe0);
        ffclos(fitshdu._176_8_,&len);
        infile_local._4_4_ = len;
      }
      else {
        wrtserr(stack0xffffffffffffffe0,"",&len,2);
        leave_early(stack0xffffffffffffffe0);
        infile_local._4_4_ = 1;
      }
    }
    else {
      wrtserr(stack0xffffffffffffffe0,"",&len,2);
      leave_early(stack0xffffffffffffffe0);
      infile_local._4_4_ = 1;
    }
  }
  return infile_local._4_4_;
}

Assistant:

int verify_fits(char *infile, FILE *out)
{
    char rootnam[FLEN_FILENAME] = "";   /* Input Fits file root name */
    fitsfile *infits;                   /* input fits file pointer */
    FitsHdu fitshdu;                    /* hdu information */
    int hdutype;
    int status = 0;
    int i;
    int len;
    char *p;
    char *pfile;
    char xtension[80];

    /* take out the leading and trailing space and skip the empty line*/
    p = infile;
    while(isspace((int)*p) )p++;
    len = strlen(p);
    pfile = p;
    p += (len -1);
    for (i = len - 1; i >= 0 && isspace((int)*p); i--) {*p = '\0'; p--;}
    if(!strlen(pfile)) return status;

#ifndef WEBTOOL
    wrtout(out," ");
    sprintf(comm,"File: %s",pfile);
    wrtout(out,comm);
#endif

    totalhdu = 0;

#ifndef STANDALONE
    /* discard the extension, rowfilter... */
    if(ffrtnm(pfile, rootnam, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }

    if(fits_open_file(&infits, rootnam, READONLY, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }
#else
    if(fits_open_diskfile(&infits, pfile, READONLY, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }
#endif

    /* get the total hdus */
    if(fits_get_num_hdus(infits, &totalhdu, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }

    /* initialize the report */
    init_report(out,rootnam);
    /*------------------  Hdu Loop --------------------------------*/
    for (i = 1; i <= totalhdu; i++) {
        /* move to the right hdu and do the CFITSIO test */
        hdutype = -1;
        if(fits_movabs_hdu(infits,i, &hdutype, &status) ) {
            print_title(out,i, hdutype);
            wrtferr(out,"",&status,2);
            set_hdubasic(i,hdutype);
            break;
        }

        if (i != 1 && hdutype == IMAGE_HDU) {
           /* test if this is a tile compressed image in a binary table */
           fits_read_key(infits, TSTRING, "XTENSION", xtension, NULL, &status);
           if (!strcmp(xtension, "BINTABLE") )
               print_title(out,i, BINARY_TBL);
	   else
	       print_title(out,i, hdutype);
        }  
        else
               print_title(out,i, hdutype);

        init_hdu(infits,out,i,hdutype,
            &fitshdu);                          /* initialize fitshdu  */

        test_hdu(infits,out,&fitshdu);          /* test hdu header */

        if(testdata)
            test_data(infits,out,&fitshdu);

        close_err(out);                         /* end of error report */

        if(prhead)
            print_header(out);
        if(prstat)
            print_summary(infits,out,&fitshdu);
        close_hdu(&fitshdu);                    /* clear the fitshdu  */
    }
    /* test the end of file  */
    test_end(infits,out);

    /*------------------ Closing  --------------------------------*/
    /* closing the report*/
    close_report(out);

    /* close the input fitsfile  */
    fits_close_file(infits, &status);

    return status;
}